

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O2

string * __thiscall
Downloader::get_compiler_abi_cxx11_
          (string *__return_storage_ptr__,Downloader *this,bool allow_default)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  bool bVar3;
  ostream *poVar4;
  pointer __lhs;
  CCDir local_110;
  
  ppVar2 = args.options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = args.options.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != ppVar2; __lhs = __lhs + 1) {
    bVar3 = std::operator==(&__lhs->first,"-c");
    if ((bVar3) || (bVar3 = std::operator==(&__lhs->first,"--compiler"), bVar3)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__lhs->second);
      return __return_storage_ptr__;
    }
  }
  if (allow_default) {
    get_default_compiler();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_110.compiler_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.compiler_name._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_110.compiler_name.field_2._M_allocated_capacity._1_7_,
                    local_110.compiler_name.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_110.compiler_name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_110.compiler_name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_110.compiler_name.field_2._M_allocated_capacity._1_7_,
                    local_110.compiler_name.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_110.compiler_name._M_string_length;
    local_110.compiler_name._M_string_length = 0;
    local_110.compiler_name.field_2._M_local_buf[0] = '\0';
    local_110.compiler_name._M_dataplus._M_p = (pointer)paVar1;
    CCDir::~CCDir(&local_110);
    bVar3 = std::operator==(__return_storage_ptr__,"");
    if (!bVar3) {
      poVar4 = operator<<((ostream *)&std::cout,(_xout_color)SUB41(ispring::xout._60_4_,2));
      poVar4 = std::operator<<(poVar4,
                               "Compiler is not specified for installer. Use the default compiler.")
      ;
      poVar4 = operator<<(poVar4,ispring::xout[0x3a]);
      poVar4 = std::operator<<(poVar4,(string *)__return_storage_ptr__);
      poVar4 = operator<<(poVar4,ispring::xout[0x37]);
      std::endl<char,std::char_traits<char>>(poVar4);
      return __return_storage_ptr__;
    }
    poVar4 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._60_4_);
    poVar4 = std::operator<<(poVar4,"No compiler found.");
    poVar4 = operator<<(poVar4,ispring::xout[0x37]);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    poVar4 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._60_4_);
    poVar4 = std::operator<<(poVar4,"Specify compiler name using -c <compiler>.");
    poVar4 = operator<<(poVar4,ispring::xout[0x37]);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  exit(1);
}

Assistant:

std::string get_compiler(bool allow_default=true){
        for(auto&e:args.options){
            if(e.first=="-c" || e.first=="--compiler"){
                return e.second;
            }
        }
        if(allow_default==false){
            std::cout << ispring::xout.light_red << "Specify compiler name using -c <compiler>." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::string compiler_name=get_default_compiler().compiler_name;
        if(compiler_name==""){
            std::cout << ispring::xout.light_red << "No compiler found." << ispring::xout.white << std::endl;
            exit(1);
        }
        std::cout << ispring::xout.light_yellow << "Compiler is not specified for installer. Use the default compiler." << ispring::xout.light_green <<compiler_name << ispring::xout.white << std::endl;
        return compiler_name;
    }